

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O1

void av1_find_best_ref_mvs_from_stack
               (int allow_hp,MB_MODE_INFO_EXT *mbmi_ext,MV_REFERENCE_FRAME ref_frame,
               int_mv *nearest_mv,int_mv *near_mv,int is_integer)

{
  ushort uVar1;
  short sVar2;
  int_mv iVar3;
  uint uVar4;
  uint uVar5;
  MV_REFERENCE_FRAME ref_frames [2];
  MV_REFERENCE_FRAME local_2a [2];
  
  local_2a[1] = 0xff;
  local_2a[0] = ref_frame;
  iVar3 = av1_get_ref_mv_from_stack(0,local_2a,0,mbmi_ext);
  *nearest_mv = iVar3;
  if (is_integer == 0) {
    if (allow_hp == 0) {
      uVar1 = (nearest_mv->as_mv).row;
      if ((uVar1 & 1) != 0) {
        (nearest_mv->as_mv).row = uVar1 + (ushort)((short)uVar1 < 1) * 2 + -1;
      }
      uVar1 = (nearest_mv->as_mv).col;
      if ((uVar1 & 1) != 0) {
        (nearest_mv->as_mv).col = uVar1 + (ushort)((short)uVar1 < 1) * 2 + -1;
      }
    }
  }
  else {
    uVar4 = (int)(nearest_mv->as_mv).row % 8;
    if (uVar4 != 0) {
      sVar2 = (nearest_mv->as_mv).row - (short)uVar4;
      (nearest_mv->as_mv).row = sVar2;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      if (4 < uVar5) {
        (nearest_mv->as_mv).row = sVar2 + (ushort)(0 < (int)uVar4) * 0x10 + -8;
      }
    }
    uVar4 = (int)(nearest_mv->as_mv).col % 8;
    if (uVar4 != 0) {
      sVar2 = (nearest_mv->as_mv).col - (short)uVar4;
      (nearest_mv->as_mv).col = sVar2;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      if (4 < uVar5) {
        if ((int)uVar4 < 1) {
          sVar2 = sVar2 + -8;
        }
        else {
          sVar2 = sVar2 + 8;
        }
        (nearest_mv->as_mv).col = sVar2;
      }
    }
  }
  iVar3 = av1_get_ref_mv_from_stack(0,local_2a,1,mbmi_ext);
  *near_mv = iVar3;
  if (is_integer == 0) {
    if (allow_hp == 0) {
      uVar1 = (near_mv->as_mv).row;
      if ((uVar1 & 1) != 0) {
        (near_mv->as_mv).row = uVar1 + (ushort)((short)uVar1 < 1) * 2 + -1;
      }
      uVar1 = (near_mv->as_mv).col;
      if ((uVar1 & 1) != 0) {
        (near_mv->as_mv).col = uVar1 + (ushort)((short)uVar1 < 1) * 2 + -1;
      }
    }
  }
  else {
    uVar4 = (int)(near_mv->as_mv).row % 8;
    if (uVar4 != 0) {
      sVar2 = (near_mv->as_mv).row - (short)uVar4;
      (near_mv->as_mv).row = sVar2;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      if (4 < uVar5) {
        (near_mv->as_mv).row = sVar2 + (ushort)(0 < (int)uVar4) * 0x10 + -8;
      }
    }
    uVar4 = (int)(near_mv->as_mv).col % 8;
    if (uVar4 != 0) {
      sVar2 = (near_mv->as_mv).col - (short)uVar4;
      (near_mv->as_mv).col = sVar2;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      if (4 < uVar5) {
        if ((int)uVar4 < 1) {
          sVar2 = sVar2 + -8;
        }
        else {
          sVar2 = sVar2 + 8;
        }
        (near_mv->as_mv).col = sVar2;
      }
    }
  }
  return;
}

Assistant:

void av1_find_best_ref_mvs_from_stack(int allow_hp,
                                      const MB_MODE_INFO_EXT *mbmi_ext,
                                      MV_REFERENCE_FRAME ref_frame,
                                      int_mv *nearest_mv, int_mv *near_mv,
                                      int is_integer) {
  const int ref_idx = 0;
  MV_REFERENCE_FRAME ref_frames[2] = { ref_frame, NONE_FRAME };
  *nearest_mv = av1_get_ref_mv_from_stack(ref_idx, ref_frames, 0, mbmi_ext);
  lower_mv_precision(&nearest_mv->as_mv, allow_hp, is_integer);
  *near_mv = av1_get_ref_mv_from_stack(ref_idx, ref_frames, 1, mbmi_ext);
  lower_mv_precision(&near_mv->as_mv, allow_hp, is_integer);
}